

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

qsizetype __thiscall
QCborStreamReaderPrivate::readStringChunk_utf8
          (QCborStreamReaderPrivate *this,ReadStringChunk params,qsizetype utf8len)

{
  long lVar1;
  QByteArrayView s;
  bool bVar2;
  QByteArrayView *in_RCX;
  qsizetype in_RDX;
  QCborStreamReaderPrivate *in_RSI;
  QCborStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  ReadStringChunk in_stack_00000000;
  qsizetype result;
  QByteArrayView chunk;
  undefined8 in_stack_ffffffffffffff78;
  CborError err;
  QCborStreamReaderPrivate *pQVar3;
  QByteArrayView *local_60;
  
  err = (CborError)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  local_60 = (QByteArrayView *)readStringChunk_byte(in_RSI,in_stack_00000000,in_RDX);
  if (-1 < (long)local_60) {
    QByteArrayView::QByteArrayView<QByteArray,_true>(in_RCX,(QByteArray *)local_60);
    QByteArrayView::last(local_60,(qsizetype)in_RDI);
    s.m_data = (storage_type *)pQVar3;
    s.m_size = (qsizetype)in_RCX;
    bVar2 = QtPrivate::isValidUtf8(s);
    if (!bVar2) {
      handleError(in_RDI,err);
      local_60 = (QByteArrayView *)0xffffffffffffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (qsizetype)local_60;
}

Assistant:

inline qsizetype
QCborStreamReaderPrivate::readStringChunk_utf8(ReadStringChunk params, qsizetype utf8len)
{
    qsizetype result = readStringChunk_byte(params, utf8len);
    if (result < 0)
        return result;

    // validate the UTF-8 content we've just read
    QByteArrayView chunk = *params.array;
    chunk = chunk.last(result);
    if (QtPrivate::isValidUtf8(chunk))
        return result;

    handleError(CborErrorInvalidUtf8TextString);
    return -1;
}